

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::DeleteArray<Memory::HeapAllocator,SimpleHashEntry<void*,Memory::Recycler::PinRecord>*>
               (AllocatorType *allocator,size_t count,
               SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **obj)

{
  code *pcVar1;
  bool bVar2;
  long *plVar3;
  long extraout_RDX;
  undefined8 *in_FS_OFFSET;
  code *local_48;
  FreeFuncType freeFunc;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **obj_local;
  size_t count_local;
  AllocatorType *allocator_local;
  
  if ((count != 0) &&
     (DestructArray<SimpleHashEntry<void*,Memory::Recycler::PinRecord>*>(count,obj),
     (count << 3) / count != 8)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x195,"(count * sizeof(T) / count == sizeof(T))",
                       "count * sizeof(T) / count == sizeof(T)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  local_48 = (code *)TypeAllocatorFunc<Memory::HeapAllocator,_SimpleHashEntry<void_*,_Memory::Recycler::PinRecord>_*>
                     ::GetFreeFunc();
  plVar3 = (long *)((long)&allocator->m_privateHeap + extraout_RDX);
  if (((ulong)local_48 & 1) != 0) {
    local_48 = *(code **)(local_48 + *plVar3 + -1);
  }
  (*local_48)(plVar3,obj,count << 3);
  return;
}

Assistant:

void DeleteArray(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, size_t count, T * obj)
{
    if (count == 0 && AllocatorInfo<TAllocator, T>::AllocatorType::FakeZeroLengthArray)
    {
        return;
    }

    if (count != 0)
    {
        DestructArray(count, obj);

        // DeleteArray can only be called when an array is allocated successfully.
        // So the add should never overflow
        Assert(count * sizeof(T) / count == sizeof(T));
    }

    auto freeFunc = AllocatorInfo<TAllocator, T>::AllocatorFunc::GetFreeFunc();
    (allocator->*freeFunc)((void *)obj, sizeof(T) * count);
}